

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecdsa_impl.h
# Opt level: O2

int secp256k1_der_parse_integer(secp256k1_scalar *r,uchar **sig,uchar *sigend)

{
  uchar uVar1;
  size_t sVar2;
  int iVar3;
  uchar *puVar4;
  int overflow;
  size_t rlen;
  uchar ra [32];
  
  overflow = 0;
  ra[0x10] = '\0';
  ra[0x11] = '\0';
  ra[0x12] = '\0';
  ra[0x13] = '\0';
  ra[0x14] = '\0';
  ra[0x15] = '\0';
  ra[0x16] = '\0';
  ra[0x17] = '\0';
  ra[0x18] = '\0';
  ra[0x19] = '\0';
  ra[0x1a] = '\0';
  ra[0x1b] = '\0';
  ra[0x1c] = '\0';
  ra[0x1d] = '\0';
  ra[0x1e] = '\0';
  ra[0x1f] = '\0';
  ra[0] = '\0';
  ra[1] = '\0';
  ra[2] = '\0';
  ra[3] = '\0';
  ra[4] = '\0';
  ra[5] = '\0';
  ra[6] = '\0';
  ra[7] = '\0';
  ra[8] = '\0';
  ra[9] = '\0';
  ra[10] = '\0';
  ra[0xb] = '\0';
  ra[0xc] = '\0';
  ra[0xd] = '\0';
  ra[0xe] = '\0';
  ra[0xf] = '\0';
  puVar4 = *sig;
  if (puVar4 == sigend) {
    return 0;
  }
  if (*puVar4 != '\x02') {
    return 0;
  }
  *sig = puVar4 + 1;
  iVar3 = secp256k1_der_read_len(&rlen,sig,sigend);
  if (iVar3 == 0) {
    return 0;
  }
  if (rlen == 0) {
    return 0;
  }
  puVar4 = *sig;
  if ((ulong)((long)sigend - (long)puVar4) < rlen) {
    return 0;
  }
  uVar1 = *puVar4;
  if (rlen == 1 || uVar1 != '\0') {
    if (uVar1 == 0xff && rlen != 1) {
      if ((char)puVar4[1] < '\0') {
        return 0;
      }
    }
    else if (-1 < (char)uVar1) {
      if (uVar1 == '\0') goto LAB_0010e51c;
      goto LAB_0010e52a;
    }
  }
  else {
    if (-1 < (char)puVar4[1]) {
      return 0;
    }
LAB_0010e51c:
    rlen = rlen - 1;
    puVar4 = puVar4 + 1;
    *sig = puVar4;
LAB_0010e52a:
    sVar2 = rlen;
    rlen = sVar2;
    if (rlen < 0x21) {
      if (rlen != 0) {
        memcpy(&stack0xffffffffffffffd8 + -rlen,puVar4,rlen);
      }
      secp256k1_scalar_set_b32(r,ra,&overflow);
      rlen = sVar2;
      if (overflow == 0) goto LAB_0010e569;
    }
  }
  *r = 0;
LAB_0010e569:
  *sig = *sig + rlen;
  return 1;
}

Assistant:

static int secp256k1_der_parse_integer(secp256k1_scalar *r, const unsigned char **sig, const unsigned char *sigend) {
    int overflow = 0;
    unsigned char ra[32] = {0};
    size_t rlen;

    if (*sig == sigend || **sig != 0x02) {
        /* Not a primitive integer (X.690-0207 8.3.1). */
        return 0;
    }
    (*sig)++;
    if (secp256k1_der_read_len(&rlen, sig, sigend) == 0) {
        return 0;
    }
    if (rlen == 0 || rlen > (size_t)(sigend - *sig)) {
        /* Exceeds bounds or not at least length 1 (X.690-0207 8.3.1).  */
        return 0;
    }
    if (**sig == 0x00 && rlen > 1 && (((*sig)[1]) & 0x80) == 0x00) {
        /* Excessive 0x00 padding. */
        return 0;
    }
    if (**sig == 0xFF && rlen > 1 && (((*sig)[1]) & 0x80) == 0x80) {
        /* Excessive 0xFF padding. */
        return 0;
    }
    if ((**sig & 0x80) == 0x80) {
        /* Negative. */
        overflow = 1;
    }
    /* There is at most one leading zero byte:
     * if there were two leading zero bytes, we would have failed and returned 0
     * because of excessive 0x00 padding already. */
    if (rlen > 0 && **sig == 0) {
        /* Skip leading zero byte */
        rlen--;
        (*sig)++;
    }
    if (rlen > 32) {
        overflow = 1;
    }
    if (!overflow) {
        if (rlen) memcpy(ra + 32 - rlen, *sig, rlen);
        secp256k1_scalar_set_b32(r, ra, &overflow);
    }
    if (overflow) {
        secp256k1_scalar_set_int(r, 0);
    }
    (*sig) += rlen;
    return 1;
}